

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub_string.cpp
# Opt level: O0

bool __thiscall sub_string::try_drop_prefix(sub_string *this,sub_string other)

{
  bool bVar1;
  size_t i;
  sub_string *this_local;
  sub_string other_local;
  
  other_local.begin_ = other.end_;
  this_local = (sub_string *)other.begin_;
  bVar1 = has_prefix(this,other);
  if (bVar1) {
    i = size((sub_string *)&this_local);
    advance(this,i);
  }
  return bVar1;
}

Assistant:

bool sub_string::try_drop_prefix(sub_string other)
{
    if (has_prefix(other))
    {
        advance(other.size());
        return true;
    }
    return false;
}